

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O3

int __thiscall musicBlock::findFreeChannel(musicBlock *this,uint flag,uint channel,uchar note)

{
  uint uVar1;
  ulong uVar2;
  uint slot;
  ulong uVar3;
  uint uVar4;
  channelEntry *pcVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar2 = (ulong)this->io->OPLchannels;
  if (uVar2 == 0) {
    slot = 0;
    bVar9 = true;
  }
  else {
    pcVar5 = this->channels;
    uVar6 = 0;
    uVar3 = 0;
    uVar7 = 0;
    do {
      uVar4 = 0;
      if (pcVar5->note == note) {
        uVar4 = (uint)(pcVar5->channel == channel) << 0x1e;
      }
      uVar8 = (ulong)((int)this->MLtime - (int)pcVar5->time & 0x1fffffffU |
                     (pcVar5->flags & 2) << 0x1c) |
              (long)(int)((pcVar5->flags & 0xffffff80) << 0x18 | uVar4);
      if (uVar7 < uVar8) {
        uVar3 = uVar6 & 0xffffffff;
        uVar7 = uVar8;
      }
      slot = (uint)uVar3;
      uVar6 = uVar6 + 1;
      pcVar5 = pcVar5 + 1;
    } while (uVar2 != uVar6);
    bVar9 = -1 < (int)uVar7;
  }
  if (((flag & 1) == 0) || (uVar1 = 0xffffffff, !bVar9)) {
    releaseChannel(this,slot,1);
    uVar1 = slot;
  }
  return uVar1;
}

Assistant:

int musicBlock::findFreeChannel(uint flag, uint channel, uchar note)
{
	uint i;

	ulong bestfit = 0;
	uint bestvoice = 0;

	for (i = 0; i < io->OPLchannels; ++i)
	{
		ulong magic;

		magic = ((channels[i].flags & CH_FREE) << 24) |
				((channels[i].note == note &&
					channels[i].channel == channel) << 30) |
				((channels[i].flags & CH_SUSTAIN) << 28) |
				((MLtime - channels[i].time) & 0x1fffffff);
		if (magic > bestfit)
		{
			bestfit = magic;
			bestvoice = i;
		}
	}
	if ((flag & 1) && !(bestfit & 0x80000000))
	{ // No free channels good enough
		return -1;
	}
	releaseChannel (bestvoice, 1);
	return bestvoice;
}